

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::Maybe<capnproto_test::capnp::test::TestMoreStuff::Client>::Maybe
          (Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *this,
          Maybe<capnproto_test::capnp::test::TestMoreStuff::Client> *other)

{
  bool bVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    lVar2 = *(long *)(*(long *)&(other->ptr).field_1 + -0x18);
    *(undefined8 *)((long)&(this->ptr).field_1 + 8) =
         *(undefined8 *)((long)&(other->ptr).field_1 + lVar2);
    *(undefined8 *)((long)&(this->ptr).field_1 + 0x10) =
         *(undefined8 *)((long)&(other->ptr).field_1 + lVar2 + 8);
    *(undefined8 *)((long)&(other->ptr).field_1 + lVar2 + 8) = 0;
    *(pointer_____offset_0x10___ **)&(this->ptr).field_1 =
         &capnproto_test::capnp::test::TestMoreStuff::Client::typeinfo;
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    plVar3 = *(long **)((long)&(other->ptr).field_1 + 0x10);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)&(other->ptr).field_1 + 0x10) = 0;
      puVar4 = *(undefined8 **)((long)&(other->ptr).field_1 + 8);
      (**(code **)*puVar4)(puVar4,(long)plVar3 + *(long *)(*plVar3 + -0x10));
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }